

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O0

TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_> * __thiscall
BurstSimple<unsigned_char>::operator()
          (BurstSimple<unsigned_char> *this,vector_block<unsigned_char_*,_1024U> *bucket,
          size_t depth)

{
  uchar uVar1;
  byte bVar2;
  uint uVar3;
  TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_> *this_00;
  size_t sVar4;
  uchar *puVar5;
  reference ppuVar6;
  reference pvVar7;
  byte *pbVar8;
  vector_block<unsigned_char_*,_1024U> *pvVar9;
  vector_block<unsigned_char_*,_1024U> *sub_bucket_1;
  uchar *puStack_2a0;
  uchar ch_1;
  uchar *ptr;
  vector_block<unsigned_char_*,_1024U> *sub_bucket;
  uint local_288;
  uint uStack_284;
  uchar ch;
  uint j_1;
  uint j;
  array<unsigned_char_*,_64UL> strings;
  array<unsigned_char,_64UL> cache;
  uint i;
  uint bucket_size;
  TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_> *new_node;
  size_t depth_local;
  vector_block<unsigned_char_*,_1024U> *bucket_local;
  BurstSimple<unsigned_char> *this_local;
  
  this_00 = (TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_> *)operator_new(0x18);
  TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_>::TrieNode(this_00);
  sVar4 = vector_block<unsigned_char_*,_1024U>::size(bucket);
  uVar3 = (uint)sVar4;
  cache._M_elems[0x38] = '\0';
  cache._M_elems[0x39] = '\0';
  cache._M_elems[0x3a] = '\0';
  cache._M_elems[0x3b] = '\0';
  do {
    if (uVar3 - (uVar3 & 0x3f) <= (uint)cache._M_elems._56_4_) {
      while( true ) {
        if (uVar3 <= (uint)cache._M_elems._56_4_) {
          return this_00;
        }
        puStack_2a0 = vector_block<unsigned_char_*,_1024U>::operator[]
                                (bucket,(ulong)(uint)cache._M_elems._56_4_);
        bVar2 = get_char<unsigned_char>(puStack_2a0,depth);
        pvVar9 = TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_>::get_bucket
                           (this_00,(uint)bVar2);
        if (pvVar9 == (vector_block<unsigned_char_*,_1024U> *)0x0) break;
        vector_block<unsigned_char_*,_1024U>::push_back(pvVar9,&stack0xfffffffffffffd60);
        cache._M_elems._56_4_ = cache._M_elems._56_4_ + 1;
      }
      __assert_fail("sub_bucket",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                    ,0x80,
                    "TrieNode<CharT, BucketT> *BurstSimple<unsigned char>::operator()(const BucketT &, size_t) const [CharT = unsigned char, BucketT = vector_block<unsigned char *>]"
                   );
    }
    for (uStack_284 = 0; uStack_284 < 0x40; uStack_284 = uStack_284 + 1) {
      puVar5 = vector_block<unsigned_char_*,_1024U>::operator[]
                         (bucket,(ulong)(cache._M_elems._56_4_ + uStack_284));
      ppuVar6 = std::array<unsigned_char_*,_64UL>::operator[]
                          ((array<unsigned_char_*,_64UL> *)&j_1,(ulong)uStack_284);
      *ppuVar6 = puVar5;
      ppuVar6 = std::array<unsigned_char_*,_64UL>::operator[]
                          ((array<unsigned_char_*,_64UL> *)&j_1,(ulong)uStack_284);
      uVar1 = get_char<unsigned_char>(*ppuVar6,depth);
      pvVar7 = std::array<unsigned_char,_64UL>::operator[]
                         ((array<unsigned_char,_64UL> *)((long)strings._M_elems + 0x1fc),
                          (ulong)uStack_284);
      *pvVar7 = uVar1;
    }
    for (local_288 = 0; local_288 < 0x40; local_288 = local_288 + 1) {
      pbVar8 = std::array<unsigned_char,_64UL>::operator[]
                         ((array<unsigned_char,_64UL> *)((long)strings._M_elems + 0x1fc),
                          (ulong)local_288);
      sub_bucket._7_1_ = *pbVar8;
      pvVar9 = TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_>::get_bucket
                         (this_00,(uint)sub_bucket._7_1_);
      ptr = (uchar *)pvVar9;
      if (pvVar9 == (vector_block<unsigned_char_*,_1024U> *)0x0) {
        __assert_fail("sub_bucket",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0x78,
                      "TrieNode<CharT, BucketT> *BurstSimple<unsigned char>::operator()(const BucketT &, size_t) const [CharT = unsigned char, BucketT = vector_block<unsigned char *>]"
                     );
      }
      ppuVar6 = std::array<unsigned_char_*,_64UL>::operator[]
                          ((array<unsigned_char_*,_64UL> *)&j_1,(ulong)local_288);
      vector_block<unsigned_char_*,_1024U>::push_back(pvVar9,ppuVar6);
    }
    cache._M_elems._56_4_ = cache._M_elems._56_4_ + 0x40;
  } while( true );
}

Assistant:

TrieNode<CharT, BucketT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT, BucketT>* new_node = new TrieNode<CharT, BucketT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			std::array<CharT, 64> cache;
			std::array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = new_node->get_bucket(ch);
				assert(sub_bucket);
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = new_node->get_bucket(ch);
			assert(sub_bucket);
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}